

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<std::pair<cs_impl::any,_cs_impl::any>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
::alloc<std::pair<cs_impl::any,cs_impl::any>const&>
          (allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>,_64UL,_cs_impl::default_allocator_provider>
           *this,pair<cs_impl::any,_cs_impl::any> *args)

{
  long lVar1;
  __int_type _Var2;
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *phVar3;
  new_allocator<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>_> *in_RSI;
  new_allocator<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>_> *in_RDI;
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *ptr;
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<std::pair<cs_impl::any,_cs_impl::any>_> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_002e8ed2;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>_>::
           allocate(in_RSI,__n,in_RDI);
LAB_002e8ed2:
  __gnu_cxx::new_allocator<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>>::
  construct<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,std::pair<cs_impl::any,cs_impl::any>const&>
            (in_RDI,in_stack_ffffffffffffffd8,(pair<cs_impl::any,_cs_impl::any> *)0x2e8eed);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}